

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Reader.cpp
# Opt level: O2

void __thiscall adios2::core::engine::BP3Reader::~BP3Reader(BP3Reader *this)

{
  ~BP3Reader(this);
  operator_delete(this);
  return;
}

Assistant:

BP3Reader::~BP3Reader()
{
    if (m_IsOpen)
    {
        DestructorClose(m_FailVerbose);
    }
    m_IsOpen = false;
}